

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple-test.c++
# Opt level: O0

void __thiscall kj::TestCase93::TestCase93(TestCase93 *this)

{
  TestCase93 *this_local;
  
  TestCase::TestCase(&this->super_TestCase,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                     ,0x5d,"legacy test: Tuple/RefTuple");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_007cb090;
  return;
}

Assistant:

TEST(Tuple, RefTuple) {
  uint i = 123;
  StringPtr s = "foo";

  Tuple<uint&, StringPtr&, uint, StringPtr> t = refTuple(i, s, 321, "bar");
  EXPECT_EQ(get<0>(t), 123);
  EXPECT_EQ(get<1>(t), "foo");
  EXPECT_EQ(get<2>(t), 321);
  EXPECT_EQ(get<3>(t), "bar");

  i = 456;
  s = "baz";

  EXPECT_EQ(get<0>(t), 456);
  EXPECT_EQ(get<1>(t), "baz");
  EXPECT_EQ(get<2>(t), 321);
  EXPECT_EQ(get<3>(t), "bar");
}